

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::GenerateAndSavePrivateKey(Session *this,Sock *sock)

{
  bool bVar1;
  runtime_error *this_00;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_RCX;
  long in_FS_OFFSET;
  string *local_78;
  undefined2 local_70;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  DestGenerate(this,sock);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)&local_48,
             (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  bVar1 = WriteBinaryFile(&this->m_private_key_file,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::filesystem::__cxx11::path::string(&local_68,(path *)this);
    local_70 = 0x2622;
    local_78 = &local_68;
    tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (&local_48,(tinyformat *)"Cannot save I2P private key to %s",(char *)&local_78,in_RCX)
    ;
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Session::GenerateAndSavePrivateKey(const Sock& sock)
{
    DestGenerate(sock);

    // umask is set to 0077 in common/system.cpp, which is ok.
    if (!WriteBinaryFile(m_private_key_file,
                         std::string(m_private_key.begin(), m_private_key.end()))) {
        throw std::runtime_error(
            strprintf("Cannot save I2P private key to %s", fs::quoted(fs::PathToString(m_private_key_file))));
    }
}